

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::DefaultMinimize::minimize(DefaultMinimize *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0xffffffff;
  if (p.rep_ >> 2 < (s->assign_).reason_.data_.ebo_.size) {
    uVar3 = (ulong)(s->assign_).reason_.data_.ebo_.buf[p.rep_ >> 2];
  }
  bVar1 = Solver::ccMinimize(s,(Literal)(s->shared_->step_).rep_,rec);
  if ((bVar1) &&
     (bVar1 = Solver::ccMinimize(s,(Literal)(this->super_MinimizeConstraint).tag_.rep_,rec), bVar1))
  {
    uVar4 = 0;
    do {
      bVar1 = uVar3 == uVar4;
      if (bVar1) {
        return bVar1;
      }
      bVar2 = Solver::ccMinimize(s,(Literal)*(uint32 *)
                                             (&(((SharedData *)
                                                ((this->super_MinimizeConstraint).shared_[1].up_ +
                                                -1))->adjust_).ebo_.buf +
                                             (this->undo_[uVar4].rep & 0x3fffffff)),rec);
      uVar4 = uVar4 + 1;
    } while (bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DefaultMinimize::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	assert(s.isTrue(tag_));
	uint32 stop = s.reasonData(p);
	Literal   x = s.sharedContext()->stepLiteral();
	assert(stop <= undoTop_);
	if (!s.ccMinimize(x, rec) || !s.ccMinimize(tag_, rec)) { return false; }
	for (uint32 i = 0; i != stop; ++i) {
		UndoInfo u = undo_[i];
		x = shared_->lits[u.index()].first;
		if (!s.ccMinimize(x, rec)) {
			return false;
		}
	}
	return true;
}